

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler.cpp
# Opt level: O1

long __thiscall
cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_delay_line<float>_>::
fill_internal_input(cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_delay_line<float>_>
                    *this,float *input_buffer,long *input_frames_count,float *output_buffer,
                   long param_4)

{
  cubeb_resampler_speex_one_way<float> *pcVar1;
  float *pfVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  float fVar6;
  size_t frames_resampled;
  size_t local_38;
  
  pcVar1 = (this->input_processor)._M_t.
           super___uniq_ptr_impl<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_cubeb_resampler_speex_one_way<float>_*,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
           .super__Head_base<0UL,_cubeb_resampler_speex_one_way<float>_*,_false>._M_head_impl;
  uVar5 = *input_frames_count;
  uVar4 = (ulong)(pcVar1->super_processor).channels;
  fVar6 = floorf((float)((pcVar1->resampling_in_buffer).length_ / uVar4 + (uVar5 & 0xffffffff)) /
                 pcVar1->resampling_ratio);
  auto_array<float>::push(&pcVar1->resampling_in_buffer,input_buffer,uVar5 * uVar4);
  uVar5 = ((long)(fVar6 - 9.223372e+18) & (long)fVar6 >> 0x3f | (long)fVar6) & 0xffffffff;
  if (uVar5 == 0) {
    lVar3 = *input_frames_count;
  }
  else {
    local_38 = 0;
    pfVar2 = cubeb_resampler_speex_one_way<float>::output
                       ((this->input_processor)._M_t.
                        super___uniq_ptr_impl<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cubeb_resampler_speex_one_way<float>_*,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                        .super__Head_base<0UL,_cubeb_resampler_speex_one_way<float>_*,_false>.
                        _M_head_impl,uVar5,&local_38);
    *input_frames_count = local_38;
    lVar3 = (*this->data_callback)(this->stream,this->user_ptr,pfVar2,(void *)0x0,uVar5);
    lVar3 = (lVar3 / (long)uVar5) * *input_frames_count;
  }
  return lVar3;
}

Assistant:

long
cubeb_resampler_speex<T, InputProcessor, OutputProcessor>::fill_internal_input(
    T * input_buffer, long * input_frames_count, T * output_buffer,
    long /*output_frames_needed*/)
{
  assert(input_buffer && input_frames_count && *input_frames_count &&
         !output_buffer);

  /* The input data, after eventual resampling. This is passed to the callback.
   */
  T * resampled_input = nullptr;
  uint32_t resampled_frame_count =
      input_processor->output_for_input(*input_frames_count);

  /* process the input, and present exactly `output_frames_needed` in the
   * callback. */
  input_processor->input(input_buffer, *input_frames_count);

  /* resampled_frame_count == 0 happens if the resampler
   * doesn't have enough input frames buffered to produce 1 resampled frame. */
  if (resampled_frame_count == 0) {
    return *input_frames_count;
  }

  size_t frames_resampled = 0;
  resampled_input =
      input_processor->output(resampled_frame_count, &frames_resampled);
  *input_frames_count = frames_resampled;

  long got = data_callback(stream, user_ptr, resampled_input, nullptr,
                           resampled_frame_count);

  /* Return the number of initial input frames or part of it.
   * Since output_frames_needed == 0 in input scenario, the only
   * available number outside resampler is the initial number of frames. */
  return (*input_frames_count) * (got / resampled_frame_count);
}